

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

llb_build_key_t *
llb_build_key_make_filtered_directory_contents(char *path,char **filters,int32_t count_filters)

{
  CAPIBuildKey *this;
  StringList *in_R8;
  StringRef path_00;
  char *local_e8;
  size_t local_d0;
  ArrayRef<llvm::StringRef> local_c0;
  StringList local_b0;
  BuildKey *local_a0;
  char *local_98;
  BuildKey local_90;
  value_type local_70;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filtersToPass;
  int32_t count_filters_local;
  char **filters_local;
  char *path_local;
  
  filtersToPass.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = count_filters;
  memset(local_58,0,0x18);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_58);
  for (local_5c = 0;
      local_5c <
      filtersToPass.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_5c = local_5c + 1) {
    local_70.Data = filters[local_5c];
    if (local_70.Data == (char *)0x0) {
      local_d0 = 0;
    }
    else {
      local_d0 = strlen(local_70.Data);
    }
    local_70.Length = local_d0;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_58,&local_70);
  }
  this = (CAPIBuildKey *)operator_new(0x38);
  local_a0 = (BuildKey *)path;
  if (path == (char *)0x0) {
    local_e8 = (char *)0x0;
  }
  else {
    local_e8 = (char *)strlen(path);
  }
  local_98 = local_e8;
  llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
            (&local_c0,(vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_58);
  llbuild::basic::StringList::StringList<llvm::StringRef>(&local_b0,local_c0);
  path_00.Length = (size_t)&local_b0;
  path_00.Data = local_98;
  llbuild::buildsystem::BuildKey::makeFilteredDirectoryContents(&local_90,local_a0,path_00,in_R8);
  anon_unknown.dwarf_1e10c2::CAPIBuildKey::CAPIBuildKey(this,&local_90);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_90);
  llbuild::basic::StringList::~StringList(&local_b0);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_58);
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_filtered_directory_contents(const char *path, const char *const *filters, int32_t count_filters) {
  auto filtersToPass = std::vector<StringRef>();
  for (int i = 0; i < count_filters; i++) {
    filtersToPass.push_back(StringRef(filters[i]));
  }
  
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeFilteredDirectoryContents(StringRef(path), basic::StringList(ArrayRef<StringRef>(filtersToPass))));
}